

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O2

int str_hash(st_data_t astring)

{
  int iVar1;
  
  iVar1 = 0;
  for (; *(char *)astring != '\0'; astring = astring + 1) {
    iVar1 = iVar1 * 0x3e5 + (int)*(char *)astring;
  }
  return (iVar1 >> 5) + iVar1;
}

Assistant:

static int
str_hash(st_data_t astring)
{
  const char* string = (const char* )astring;
  register int c;

#ifdef HASH_ELFHASH
  register unsigned int h = 0, g;

  while ((c = *string++) != '\0') {
    h = ( h << 4 ) + c;
    if ( g = h & 0xF0000000 )
	    h ^= g >> 24;
    h &= ~g;
  }
  return h;
#elif HASH_PERL
  register int val = 0;

  while ((c = *string++) != '\0') {
    val += c;
    val += (val << 10);
    val ^= (val >> 6);
  }
  val += (val << 3);
  val ^= (val >> 11);

  return val + (val << 15);
#else
  register int val = 0;

  while ((c = *string++) != '\0') {
    val = val*997 + c;
  }

  return val + (val>>5);
#endif
}